

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DoubleVector::SerializeWithCachedSizes
          (DoubleVector *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<double> *this_00;
  double *a;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DoubleVector *this_local;
  
  iVar1 = vector_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_vector_cached_byte_size_);
    this_00 = vector(this);
    a = google::protobuf::RepeatedField<double>::data(this_00);
    iVar1 = vector_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(a,iVar1,output);
  }
  return;
}

Assistant:

void DoubleVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DoubleVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double vector = 1;
  if (this->vector_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_vector_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->vector().data(), this->vector_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DoubleVector)
}